

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O3

BYTE * __thiscall FCELTexture::GetColumn(FCELTexture *this,uint column,Span **spans)

{
  ushort uVar1;
  ushort uVar2;
  Span **ppSVar3;
  
  if (this->m_pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  uVar1 = (this->super_FTexture).Width;
  if (uVar1 <= column) {
    uVar2 = (this->super_FTexture).WidthMask;
    if (uVar2 + 1 == (uint)uVar1) {
      column = uVar2 & column;
    }
    else {
      column = column % (uint)uVar1;
    }
  }
  if (spans != (Span **)0x0) {
    ppSVar3 = this->m_spans;
    if (ppSVar3 == (Span **)0x0) {
      ppSVar3 = FTexture::CreateSpans(&this->super_FTexture,this->m_pixels);
      this->m_spans = ppSVar3;
    }
    *spans = ppSVar3[column];
  }
  return this->m_pixels + column * (this->super_FTexture).Height;
}

Assistant:

const BYTE* FCELTexture::GetColumn(unsigned int column, const Span** spans)
{
	if (m_pixels == NULL)
	{
		MakeTexture();
	}

	if (DWORD(column) >= DWORD(Width))
	{
		if (WidthMask + 1 == Width)
		{
			column &= WidthMask;
		}
		else
		{
			column %= Width;
		}
	}

	if (NULL != spans)
	{
		if (NULL == m_spans)
		{
			m_spans = CreateSpans(m_pixels);
		}

		*spans = m_spans[column];
	}

	return m_pixels + column * Height;
}